

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

void __thiscall groundupdb::EncodedValue::EncodedValue(EncodedValue *this,string *from)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->m_has_value = true;
  this->m_type = CPP;
  pcVar1 = (from->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + from->_M_string_length);
  HashedValue::HashedValue<std::__cxx11::string>(&this->m_value,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

EncodedValue(const std::string& from) : m_has_value(true), m_type(Type::CPP), m_value(HashedValue{from}) {}